

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Implicit_manifold_intersection_oracle.h
# Opt level: O3

Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
* __thiscall
Gudhi::coxeter_triangulation::
Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
::
intersection_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
          (Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *__return_storage_ptr__,
          Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
          *this,VectorXd *lambda,
          Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *simplex,Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   *triangulation)

{
  double dVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
  *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *pQVar8;
  invalid_argument *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
  *pIVar10;
  long lVar11;
  byte bVar12;
  undefined8 *puVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *cols;
  long rows;
  long lVar15;
  MatrixXd vertex_matrix;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  v_it;
  VectorXd intersection;
  Vertex_range v_range;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  Query_result<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_110;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_108;
  DenseStorage<double,__1,__1,_1,_0> local_d8;
  vector<int,_std::allocator<int>_> local_c8;
  byte local_b0;
  Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_a8;
  Vertex_range local_a0;
  VectorXd *local_40;
  undefined1 *local_38;
  
  uVar2 = (triangulation->
          super_Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ).dimension_;
  cols = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(0,uVar2);
  pvVar3 = (simplex->partition_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (simplex->partition_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar5 = (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
            *)(lambda->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows;
  local_a8 = triangulation;
  if (pIVar5 != (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
                 *)0x0) {
    pIVar10 = (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
               *)0x0;
    this = (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_torus_in_R3,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
            *)0x0;
    if (0 < (long)pIVar5) {
      this = pIVar5;
    }
    do {
      if (this == pIVar10) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      dVar1 = (lambda->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data[(long)pIVar10];
      if (NAN(dVar1)) {
LAB_001216fd:
        (__return_storage_ptr__->intersection).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)0x0;
        (__return_storage_ptr__->intersection).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
        __return_storage_ptr__->success = false;
        return __return_storage_ptr__;
      }
      if ((ABS(dVar1) <= 2.220446049250313e-16) || (ABS(dVar1 + -1.0) <= 2.220446049250313e-16)) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this_00,"A vertex of the triangulation lies exactly on the manifold");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if ((dVar1 < 0.0) || (1.0 < dVar1)) goto LAB_001216fd;
      pIVar10 = pIVar10 + 1;
    } while (pIVar5 != pIVar10);
  }
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  local_128.m_cols = 0;
  if ((long)pvVar4 - (long)pvVar3 < -0x17) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  rows = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
  local_110 = __return_storage_ptr__;
  if ((cols != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0 && pvVar4 != pvVar3) &&
     (auVar6._8_8_ = 0, auVar6._0_8_ = cols,
     auVar7 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff), SUB168(auVar7 / auVar6,0) < rows)) {
    puVar13 = (undefined8 *)__cxa_allocate_exception(8,this,SUB168(auVar7 % auVar6,0));
    *puVar13 = operator_delete;
    __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,rows * (long)cols,rows,(Index)cols);
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range(&local_a0,simplex);
  local_108.o_it_._M_current =
       local_a0.
       super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.o_it_._M_current;
  local_108.o_end_._M_current =
       local_a0.
       super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.o_end_._M_current;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_108.value_,
             &local_a0.
              super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
              .m_Begin.value_);
  local_108.is_end_ =
       local_a0.
       super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.is_end_;
  if (pvVar4 != pvVar3) {
    lVar15 = 0;
    lVar11 = 0;
    do {
      local_d8.m_data =
           (double *)
           local_a0.
           super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_End.o_it_._M_current;
      local_d8.m_rows =
           (Index)local_a0.
                  super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                  .m_End.o_end_._M_current;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_c8,
                 &local_a0.
                  super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                  .m_End.value_);
      local_b0 = local_a0.
                 super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.is_end_;
      bVar12 = local_a0.
               super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.is_end_ & local_108.is_end_;
      if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (bVar12 != 0) break;
      Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::cartesian_coordinates
                ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)&local_d8,(Vertex_handle *)local_a8,1.0);
      if (uVar2 != 0) {
        pvVar9 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8.m_rows;
        if (local_d8.m_rows < 1) {
          pvVar9 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
        }
        puVar13 = (undefined8 *)((long)local_128.m_data + lVar15);
        pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
        do {
          if (pvVar9 == pvVar14) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          if (((lVar11 < 0) || (local_128.m_rows <= lVar11)) || (local_128.m_cols <= (long)pvVar14))
          {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          *puVar13 = (&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                        local_d8.m_data)->_M_impl).super__Vector_impl_data._M_start)[(long)pvVar14];
          pvVar14 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    ((long)&(pvVar14->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
          puVar13 = puVar13 + local_128.m_rows;
        } while (cols != pvVar14);
      }
      free(local_d8.m_data);
      if (local_108.is_end_ == false) {
        Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::update_value(&local_108);
        local_108.o_it_._M_current = local_108.o_it_._M_current + 1;
        if (local_108.o_it_._M_current == local_108.o_end_._M_current) {
          local_108.is_end_ = true;
        }
      }
      lVar11 = lVar11 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar11 != rows + (ulong)(rows == 0));
  }
  if ((lambda->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      local_128.m_rows) {
    local_40 = lambda;
    local_38 = (undefined1 *)&local_128;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d8,
               (DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_40);
    pQVar8 = local_110;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)local_110,&local_d8);
    pQVar8->success = true;
    free(local_d8.m_data);
    if (local_108.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double *)
        local_a0.
        super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_End.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (double *)0x0) {
      operator_delete(local_a0.
                      super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_End.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.
                            super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_End.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.
                            super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_End.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double *)
        local_a0.
        super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_a0.
                      super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.
                            super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.
                            super_iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                            .m_Begin.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    free(local_128.m_data);
    return local_110;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
               );
}

Assistant:

Query_result<Simplex_handle> intersection_result(const Eigen::VectorXd& lambda, const Simplex_handle& simplex,
                                                   const Triangulation& triangulation) const {
    using QR = Query_result<Simplex_handle>;
    std::size_t amb_d = triangulation.dimension();
    std::size_t cod_d = simplex.dimension();
    for (std::size_t i = 0; i < (std::size_t)lambda.size(); ++i) {
      if (std::isnan(lambda(i))) return QR({Eigen::VectorXd(), false});
      GUDHI_CHECK((std::fabs(lambda(i) - 1.) > std::numeric_limits<double>::epsilon() &&
                   std::fabs(lambda(i) - 0.) > std::numeric_limits<double>::epsilon()),
                  std::invalid_argument("A vertex of the triangulation lies exactly on the manifold"));
      if (lambda(i) < 0. || lambda(i) > 1.) return QR({Eigen::VectorXd(), false});
    }
    Eigen::MatrixXd vertex_matrix(cod_d + 1, amb_d);
    auto v_range = simplex.vertex_range();
    auto v_it = v_range.begin();
    for (std::size_t i = 0; i < cod_d + 1 && v_it != v_range.end(); ++v_it, ++i) {
      Eigen::VectorXd v_coords = triangulation.cartesian_coordinates(*v_it);
      for (std::size_t j = 0; j < amb_d; ++j) vertex_matrix(i, j) = v_coords(j);
    }
    Eigen::VectorXd intersection = lambda.transpose() * vertex_matrix;
    return QR({intersection, true});
  }